

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::AddJumpOffset
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelId,uint fieldByteOffsetFromEnd)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int32 iVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  JumpInfo local_40;
  JumpInfo jumpInfo;
  ByteCodeLabel jumpAroundLabel;
  JumpInfo jumpInfo_1;
  ByteCodeLabel longJumpLabel;
  LongJumpOffset jumpOffset;
  uint labelOffset;
  uint jumpByteOffset;
  uint fieldByteOffsetFromEnd_local;
  ByteCodeLabel labelId_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  if (99 < fieldByteOffsetFromEnd) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa8e,"(fieldByteOffsetFromEnd < 100)","Ensure valid field offset")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  CheckOpen(this);
  CheckLabel(this,labelId);
  uVar4 = Data::GetCurrentOffset(&this->m_byteCodeData);
  if ((this->useBranchIsland & 1U) != 0) {
    this->nextBranchIslandOffset = this->nextBranchIslandOffset - LongBranchSize;
    pTVar8 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this->m_labelOffsets,labelId);
    uVar1 = *pTVar8;
    if (uVar1 != 0xffffffff) {
      uVar5 = Data::GetCurrentOffset(&this->m_byteCodeData);
      if (uVar5 <= uVar1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0xa9f,"(labelOffset < m_byteCodeData.GetCurrentOffset())",
                                    "labelOffset < m_byteCodeData.GetCurrentOffset()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      uVar5 = Data::GetCurrentOffset(&this->m_byteCodeData);
      iVar6 = GetBranchLimit();
      if (SBORROW4(uVar1 - uVar5,-iVar6) != (int)((uVar1 - uVar5) + iVar6) < 0) {
        uVar4 = DefineLabel(this);
        jumpInfo.patchOffset = uVar4;
        JsUtil::
        List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->m_jumpOffsets,(JumpInfo *)&jumpInfo.patchOffset);
        jumpInfo.labelId = -1;
        bVar3 = OpCodeAttr::HasFallThrough(op);
        if (bVar3) {
          jumpInfo.labelId = DefineLabel(this);
          Br(this,jumpInfo.labelId);
        }
        MarkLabel(this,uVar4);
        BrLong(this,BrLong,labelId);
        if (jumpInfo.labelId == -1) {
          return;
        }
        MarkLabel(this,jumpInfo.labelId);
        return;
      }
    }
  }
  local_40.labelId = labelId;
  local_40.patchOffset = uVar4 - fieldByteOffsetFromEnd;
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this->m_jumpOffsets,&local_40);
  return;
}

Assistant:

void ByteCodeWriter::AddJumpOffset(Js::OpCode op, ByteCodeLabel labelId, uint fieldByteOffsetFromEnd) // Offset of "Offset" field in OpLayout, in bytes
    {
        AssertMsg(fieldByteOffsetFromEnd < 100, "Ensure valid field offset");
        CheckOpen();
        CheckLabel(labelId);

        uint jumpByteOffset = m_byteCodeData.GetCurrentOffset() - fieldByteOffsetFromEnd;
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // Any Jump might need a long jump, account for that emit the branch island earlier.
            // Even if it is a back edge and we are going to emit a long jump, we will still
            // emit a branch around any way.
            this->nextBranchIslandOffset -= LongBranchSize;

            uint labelOffset = m_labelOffsets->Item(labelId);
            if (labelOffset != UINT_MAX)
            {
                // Back branch, see if it needs to be long
                Assert(labelOffset < m_byteCodeData.GetCurrentOffset());
                LongJumpOffset jumpOffset = labelOffset - m_byteCodeData.GetCurrentOffset();
                if (jumpOffset < -GetBranchLimit())
                {
                    // Create the long jump label and add the original jump offset to the list first
                    ByteCodeLabel longJumpLabel = this->DefineLabel();
                    JumpInfo jumpInfo = { longJumpLabel, jumpByteOffset };
                    m_jumpOffsets->Add(jumpInfo);

                    // Emit the jump around (if necessary)
                    ByteCodeLabel jumpAroundLabel = (ByteCodeLabel)-1;
                    if (OpCodeAttr::HasFallThrough(op))
                    {
                        // emit jump around.
                        jumpAroundLabel = this->DefineLabel();
                        this->Br(jumpAroundLabel);
                    }

                    // emit the long jump
                    this->MarkLabel(longJumpLabel);
                    this->BrLong(Js::OpCode::BrLong, labelId);

                    if (jumpAroundLabel != (ByteCodeLabel)-1)
                    {
                        this->MarkLabel(jumpAroundLabel);
                    }
                    return;
                }
            }
        }
#endif
        //
        // Branch targets are created in two passes:
        // - In the instruction stream, write "labelID" into "OpLayoutBrC.Offset".  Record this
        //   location in "m_jumpOffsets" to be patched later.
        // - When the byte-code is closed, update all "OpLayoutBrC.Offset"'s with their actual
        //   destinations.
        //

        JumpInfo jumpInfo = { labelId, jumpByteOffset };
        m_jumpOffsets->Add(jumpInfo);
    }